

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O3

VertexData<Vertex> * __thiscall
geometrycentral::surface::SurfaceMesh::separateNonmanifoldVertices
          (VertexData<Vertex> *__return_storage_ptr__,SurfaceMesh *this)

{
  pointer pcVar1;
  Vertex *pVVar2;
  unsigned_long uVar3;
  byte bVar4;
  size_t sVar5;
  runtime_error *this_00;
  pointer puVar6;
  pointer puVar7;
  size_t sVar8;
  size_t i;
  size_t sVar9;
  MeshData<geometrycentral::surface::Vertex,_geometrycentral::surface::Vertex> *pMVar10;
  pointer puVar11;
  size_t sVar12;
  size_t sVar13;
  Vertex VVar14;
  vector<geometrycentral::surface::Vertex,_std::allocator<geometrycentral::surface::Vertex>_>
  vertexEntries;
  VertexData<bool> baseVertexUsed;
  DisjointSets djSet;
  allocator_type local_d1;
  MeshData<geometrycentral::surface::Vertex,_geometrycentral::surface::Vertex> *local_d0;
  size_t local_c8;
  vector<geometrycentral::surface::Vertex,_std::allocator<geometrycentral::surface::Vertex>_>
  local_c0;
  size_t local_a8;
  MeshData<geometrycentral::surface::Vertex,_bool> local_a0;
  DisjointSets local_68;
  
  sVar9 = this->nHalfedgesFillCount;
  DisjointSets::DisjointSets(&local_68,sVar9);
  local_c8 = this->nEdgesFillCount;
  local_d0 = __return_storage_ptr__;
  if (local_c8 == 0) {
LAB_00162d51:
    sVar13 = 0;
  }
  else {
    puVar6 = (this->eHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar7 = (this->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar11 = puVar6;
    if (this->useImplicitTwinFlag != false) {
      puVar11 = puVar7;
    }
    if (*puVar11 != 0xffffffffffffffff) goto LAB_00162d51;
    sVar13 = 0;
    do {
      puVar6 = puVar6 + 1;
      puVar7 = puVar7 + 2;
      if (local_c8 - 1 == sVar13) goto LAB_00162d5a;
      puVar11 = puVar6;
      if (this->useImplicitTwinFlag != false) {
        puVar11 = puVar7;
      }
      sVar13 = sVar13 + 1;
    } while (*puVar11 == 0xffffffffffffffff);
  }
  if (sVar13 != local_c8) {
    bVar4 = this->useImplicitTwinFlag;
    sVar5 = local_c8 - 1;
    local_a8 = sVar9;
    do {
      if ((bVar4 & 1) == 0) {
        puVar6 = (this->heSiblingArr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        sVar12 = (this->eHalfedgeArr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[sVar13];
        sVar9 = puVar6[sVar12];
        if (sVar9 != sVar12) {
          if (puVar6[sVar9] != sVar12) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            ::std::runtime_error::runtime_error
                      (this_00,"mesh must be edge-manifold for separateNonmanifoldVertices()");
            __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error
                       );
          }
          pcVar1 = (this->heOrientArr).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((pcVar1[sVar9] != '\0') != (pcVar1[sVar12] != '\0')) goto LAB_00162e57;
          DisjointSets::merge(&local_68,sVar12,sVar9);
          puVar6 = (this->heNextArr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          DisjointSets::merge(&local_68,puVar6[sVar12],puVar6[sVar9]);
        }
      }
      else {
        sVar12 = sVar13 * 2;
        if ((this->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start[sVar13 * 2 + 1] < this->nFacesFillCount) {
          sVar9 = sVar13 * 2 + 1;
LAB_00162e57:
          DisjointSets::merge(&local_68,
                              (this->heNextArr).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start[sVar12],sVar9);
          DisjointSets::merge(&local_68,sVar12,
                              (this->heNextArr).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start[sVar9]);
        }
      }
      bVar4 = this->useImplicitTwinFlag;
      puVar6 = (this->eHalfedgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start + sVar13 + 1;
      puVar7 = (this->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start + sVar13 * 2 + 2;
      do {
        sVar9 = local_a8;
        if (sVar5 == sVar13) goto LAB_00162d5a;
        puVar11 = puVar6;
        if ((bVar4 & 1) != 0) {
          puVar11 = puVar7;
        }
        puVar6 = puVar6 + 1;
        puVar7 = puVar7 + 2;
        sVar13 = sVar13 + 1;
      } while (*puVar11 == 0xffffffffffffffff);
    } while (local_c8 != sVar13);
  }
LAB_00162d5a:
  pMVar10 = local_d0;
  MeshData<geometrycentral::surface::Vertex,_geometrycentral::surface::Vertex>::MeshData
            (local_d0,this);
  local_a0.mesh = (ParentMeshT *)0x0;
  local_a0.defaultValue = true;
  local_a0._9_7_ = 0xffffffffffffff;
  ::std::vector<geometrycentral::surface::Vertex,_std::allocator<geometrycentral::surface::Vertex>_>
  ::vector(&local_c0,sVar9,(value_type *)&local_a0,&local_d1);
  MeshData<geometrycentral::surface::Vertex,_bool>::MeshData(&local_a0,this,false);
  sVar9 = this->nHalfedgesFillCount;
  if ((sVar9 == 0) ||
     ((puVar6 = (this->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start, *puVar6 != 0xffffffffffffffff &&
      (*(this->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start < this->nFacesFillCount)))) {
    sVar13 = 0;
  }
  else {
    sVar13 = 1;
    if (sVar9 != 1) {
      do {
        if ((puVar6[sVar13] != 0xffffffffffffffff) &&
           ((this->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start[sVar13] < this->nFacesFillCount))
        goto LAB_00162f1d;
        sVar13 = sVar13 + 1;
      } while (sVar9 != sVar13);
      goto LAB_00163088;
    }
  }
LAB_00162f1d:
  if (sVar13 != sVar9) {
    while( true ) {
      sVar5 = DisjointSets::find(&local_68,sVar13);
      if (local_c0.
          super__Vector_base<geometrycentral::surface::Vertex,_std::allocator<geometrycentral::surface::Vertex>_>
          ._M_impl.super__Vector_impl_data._M_start[sVar5].
          super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind
          == 0xffffffffffffffff) {
        sVar12 = (this->heVertexArr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[sVar13];
        if (local_a0.data.super_PlainObjectBase<Eigen::Matrix<bool,__1,_1,_0,__1,_1>_>.m_storage.
            m_data[sVar12] == true) {
          VVar14 = getNewVertex(this);
          sVar8 = VVar14.
                  super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                  .ind;
          local_c0.
          super__Vector_base<geometrycentral::surface::Vertex,_std::allocator<geometrycentral::surface::Vertex>_>
          ._M_impl.super__Vector_impl_data._M_start[sVar5].
          super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
          mesh = VVar14.
                 super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                 .mesh;
          local_c0.
          super__Vector_base<geometrycentral::surface::Vertex,_std::allocator<geometrycentral::surface::Vertex>_>
          ._M_impl.super__Vector_impl_data._M_start[sVar5].
          super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind
               = sVar8;
          pVVar2 = (local_d0->data).
                   super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::Vertex,__1,_1,_0,__1,_1>_>
                   .m_storage.m_data;
          pVVar2[sVar8].
          super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
          mesh = this;
          pVVar2[sVar8].
          super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind
               = sVar12;
          pMVar10 = local_d0;
        }
        else {
          pVVar2 = (local_d0->data).
                   super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::Vertex,__1,_1,_0,__1,_1>_>
                   .m_storage.m_data;
          pVVar2[sVar12].
          super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
          mesh = this;
          pVVar2[sVar12].
          super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind
               = sVar12;
          local_c0.
          super__Vector_base<geometrycentral::surface::Vertex,_std::allocator<geometrycentral::surface::Vertex>_>
          ._M_impl.super__Vector_impl_data._M_start[sVar5].
          super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
          mesh = this;
          local_c0.
          super__Vector_base<geometrycentral::surface::Vertex,_std::allocator<geometrycentral::surface::Vertex>_>
          ._M_impl.super__Vector_impl_data._M_start[sVar5].
          super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind
               = sVar12;
          local_a0.data.super_PlainObjectBase<Eigen::Matrix<bool,__1,_1,_0,__1,_1>_>.m_storage.
          m_data[sVar12] = true;
          pMVar10 = local_d0;
        }
      }
      uVar3 = local_c0.
              super__Vector_base<geometrycentral::surface::Vertex,_std::allocator<geometrycentral::surface::Vertex>_>
              ._M_impl.super__Vector_impl_data._M_start[sVar5].
              super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
              .ind;
      (this->heVertexArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[sVar13] = uVar3;
      (this->vHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_start[uVar3] = sVar13;
      sVar13 = sVar13 + 1;
      if (sVar13 == sVar9) break;
      while (((this->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start[sVar13] == 0xffffffffffffffff ||
             (this->nFacesFillCount <=
              (this->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start[sVar13]))) {
        sVar13 = sVar13 + 1;
        if (sVar9 == sVar13) goto LAB_00163088;
      }
      if (sVar9 == sVar13) break;
    }
  }
LAB_00163088:
  initializeHalfedgeNeighbors(this);
  this->modificationTick = this->modificationTick + 1;
  MeshData<geometrycentral::surface::Vertex,_bool>::~MeshData(&local_a0);
  if (local_c0.
      super__Vector_base<geometrycentral::surface::Vertex,_std::allocator<geometrycentral::surface::Vertex>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.
                    super__Vector_base<geometrycentral::surface::Vertex,_std::allocator<geometrycentral::surface::Vertex>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.rank.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.rank.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.parent.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.parent.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return pMVar10;
}

Assistant:

VertexData<Vertex> SurfaceMesh::separateNonmanifoldVertices() {

  // Find edge-connected sets of corners
  size_t indMax = nHalfedgesFillCount;
  DisjointSets djSet(indMax);
  for (Edge e : edges()) {
    if (e.isBoundary()) continue;
    if (!e.isManifold()) {
      throw std::runtime_error("mesh must be edge-manifold for separateNonmanifoldVertices()");
    }
    Halfedge heA = e.halfedge();
    Halfedge heB = heA.sibling();

    if (heA.orientation() == heB.orientation()) {
      djSet.merge(heA.corner().getIndex(), heB.corner().getIndex());
      djSet.merge(heA.next().corner().getIndex(), heB.next().corner().getIndex());
    } else {
      djSet.merge(heA.next().corner().getIndex(), heB.corner().getIndex());
      djSet.merge(heA.corner().getIndex(), heB.next().corner().getIndex());
    }
  }

  // Make sure there is a distinct vertex entry for each component
  VertexData<Vertex> parents(*this);
  std::vector<Vertex> vertexEntries(indMax, Vertex());
  VertexData<bool> baseVertexUsed(*this, false);
  for (Corner c : corners()) {
    size_t iComp = djSet.find(c.getIndex());
    Vertex origV = c.vertex();

    // create vertex if needed
    if (vertexEntries[iComp] == Vertex()) {
      if (baseVertexUsed[origV]) {
        Vertex newV = getNewVertex();
        vertexEntries[iComp] = newV;
        parents[newV] = origV;
      } else {
        parents[origV] = origV;
        vertexEntries[iComp] = origV;
        baseVertexUsed[origV] = true;
      }
    }

    // hook up
    Vertex targetV = vertexEntries[iComp];
    Halfedge he = c.halfedge();
    heVertexArr[he.getIndex()] = targetV.getIndex();
    vHalfedgeArr[targetV.getIndex()] = he.getIndex();
  }

  // just rebuild these from scratch, rather than trying to maintain
  initializeHalfedgeNeighbors();

  modificationTick++;
  return parents;
}